

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_node __thiscall pugi::xml_node::append_move(xml_node *this,xml_node *moved)

{
  ulong *puVar1;
  bool bVar2;
  xml_node unaff_RBX;
  xml_node *pxVar3;
  xml_node unaff_R14;
  xml_node local_18;
  
  pxVar3 = &local_18;
  bVar2 = impl::anon_unknown_0::allow_move(unaff_R14,unaff_RBX);
  if (bVar2) {
    puVar1 = (ulong *)(*(long *)((long)this->_root - (this->_root->header >> 8)) + -0x40);
    *puVar1 = *puVar1 | 0x40;
    impl::anon_unknown_0::remove_node(moved->_root);
    impl::anon_unknown_0::append_node(moved->_root,this->_root);
    pxVar3 = moved;
  }
  else {
    xml_node(&local_18);
  }
  return (xml_node)pxVar3->_root;
}

Assistant:

PUGI_IMPL_FN xml_node xml_node::append_move(const xml_node& moved)
	{
		if (!impl::allow_move(*this, moved)) return xml_node();

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return xml_node();

		// disable document_buffer_order optimization since moving nodes around changes document order without changing buffer pointers
		impl::get_document(_root).header |= impl::xml_memory_page_contents_shared_mask;

		impl::remove_node(moved._root);
		impl::append_node(moved._root, _root);

		return moved;
	}